

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

PyObject * pybind11::detail::dict_getitemstringref(PyObject *v,char *key)

{
  PyObject *pPVar1;
  long lVar2;
  error_already_set *this;
  
  pPVar1 = dict_getitemstring(v,key);
  if (pPVar1 == (PyObject *)0x0) {
    lVar2 = PyErr_Occurred();
    if (lVar2 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x18);
      error_already_set::error_already_set(this);
      __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
  }
  else {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  return pPVar1;
}

Assistant:

inline PyObject *dict_getitemstringref(PyObject *v, const char *key) {
#if PY_VERSION_HEX >= 0x030D0000
    PyObject *rv;
    if (PyDict_GetItemStringRef(v, key, &rv) < 0) {
        throw error_already_set();
    }
    return rv;
#else
    PyObject *rv = dict_getitemstring(v, key);
    if (rv == nullptr && PyErr_Occurred()) {
        throw error_already_set();
    }
    Py_XINCREF(rv);
    return rv;
#endif
}